

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

string * __thiscall
gl3cts::TextureSwizzle::SmokeTest::prepareCoordinates_abi_cxx11_
          (string *__return_storage_ptr__,SmokeTest *this,testCase *test_case)

{
  size_t sVar1;
  TestError *pTVar2;
  size_t start_position_2;
  size_t i_2;
  size_t start_position_1;
  size_t i_1;
  size_t start_position;
  size_t i;
  size_t position;
  allocator<char> local_3a;
  undefined1 local_39;
  char *local_38;
  GLchar *type;
  _texture_target *target;
  _texture_access *access;
  testCase *test_case_local;
  SmokeTest *this_local;
  string *coordinates;
  
  target = (_texture_target *)(texture_access + test_case->m_texture_access_index * 0x18);
  type = texture_targets + test_case->m_source_texture_target_index * 0x30;
  local_38 = (char *)0x0;
  local_39 = 0;
  access = (_texture_access *)test_case;
  test_case_local = (testCase *)this;
  this_local = (SmokeTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"TYPE(VAL_LIST)",&local_3a);
  std::allocator<char>::~allocator(&local_3a);
  if ((target->m_n_derivatives & 0x100) == 0) {
    switch(*(long *)(type + 8) + -1 + target->m_n_coordinates + *(long *)type) {
    case 0:
      local_38 = "float";
      break;
    case 1:
      local_38 = "vec2";
      break;
    case 2:
      local_38 = "vec3";
      break;
    case 3:
      local_38 = "vec4";
      break;
    default:
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Invalid value",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0xc9d);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  else {
    switch(*(long *)(type + 8) + -1 + target->m_n_coordinates + *(long *)type) {
    case 0:
      local_38 = "int";
      break;
    case 1:
      local_38 = "ivec2";
      break;
    case 2:
      local_38 = "ivec3";
      break;
    case 3:
      local_38 = "ivec4";
      break;
    default:
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Invalid value",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0xcb2);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  i = 0;
  Utils::replaceToken("TYPE",&i,local_38,__return_storage_ptr__);
  for (start_position = 0; sVar1 = i, start_position < *(ulong *)(type + 8);
      start_position = start_position + 1) {
    Utils::replaceToken("VAL_LIST",&i,"0, VAL_LIST",__return_storage_ptr__);
    i = sVar1 + 1;
  }
  for (start_position_1 = 0; sVar1 = i, start_position_1 < *(ulong *)type;
      start_position_1 = start_position_1 + 1) {
    Utils::replaceToken("VAL_LIST",&i,"0, VAL_LIST",__return_storage_ptr__);
    i = sVar1 + 1;
  }
  for (start_position_2 = 0; sVar1 = i, start_position_2 < target->m_n_coordinates;
      start_position_2 = start_position_2 + 1) {
    Utils::replaceToken("VAL_LIST",&i,"1, VAL_LIST",__return_storage_ptr__);
    i = sVar1 + 1;
  }
  Utils::replaceToken(", VAL_LIST",&i,"",__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string SmokeTest::prepareCoordinates(const testCase& test_case)
{
	const _texture_access& access = texture_access[test_case.m_texture_access_index];
	const _texture_target& target = texture_targets[test_case.m_source_texture_target_index];

	const glw::GLchar* type = 0;

	std::string coordinates = "TYPE(VAL_LIST)";

	if (false == access.m_use_integral_coordinates)
	{
		switch (access.m_n_coordinates + target.m_n_array_coordinates + target.m_n_coordinates)
		{
		case 1:
			type = "float";
			break;
		case 2:
			type = "vec2";
			break;
		case 3:
			type = "vec3";
			break;
		case 4:
			type = "vec4";
			break;
		default:
			TCU_FAIL("Invalid value");
			break;
		}
	}
	else
	{
		switch (access.m_n_coordinates + target.m_n_array_coordinates + target.m_n_coordinates)
		{
		case 1:
			type = "int";
			break;
		case 2:
			type = "ivec2";
			break;
		case 3:
			type = "ivec3";
			break;
		case 4:
			type = "ivec4";
			break;
		default:
			TCU_FAIL("Invalid value");
			break;
		}
	}

	size_t position = 0;

	Utils::replaceToken("TYPE", position, type, coordinates);

	for (size_t i = 0; i < target.m_n_coordinates; ++i)
	{
		size_t start_position = position;

		Utils::replaceToken("VAL_LIST", position, "0, VAL_LIST", coordinates);

		position = start_position + 1;
	}

	for (size_t i = 0; i < target.m_n_array_coordinates; ++i)
	{
		size_t start_position = position;

		Utils::replaceToken("VAL_LIST", position, "0, VAL_LIST", coordinates);

		position = start_position + 1;
	}

	for (size_t i = 0; i < access.m_n_coordinates; ++i)
	{
		size_t start_position = position;

		Utils::replaceToken("VAL_LIST", position, "1, VAL_LIST", coordinates);

		position = start_position + 1;
	}

	Utils::replaceToken(", VAL_LIST", position, "", coordinates);

	return coordinates;
}